

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O3

Own<kj::_::AdapterPromiseNode<siginfo_t,_kj::UnixEventPort::SignalPromiseAdapter>,_kj::_::PromiseDisposer>
 __thiscall
kj::_::PromiseDisposer::
alloc<kj::_::AdapterPromiseNode<siginfo_t,kj::UnixEventPort::SignalPromiseAdapter>,kj::_::PromiseDisposer,kj::UnixEventPort&,int&>
          (PromiseDisposer *this,UnixEventPort *params,int *params_1)

{
  int iVar1;
  SignalPromiseAdapter **ppSVar2;
  void *pvVar3;
  
  pvVar3 = operator_new(0x400);
  *(undefined8 *)((long)pvVar3 + 0x1a0) = 0;
  *(undefined ***)((long)pvVar3 + 400) = &PTR_destroy_006e2b28;
  *(undefined ***)((long)pvVar3 + 0x1a8) = &PTR_reject_006e2b78;
  *(undefined1 *)((long)pvVar3 + 0x1b0) = 0;
  *(undefined1 *)((long)pvVar3 + 0x348) = 0;
  *(undefined1 *)((long)pvVar3 + 0x3d0) = 1;
  iVar1 = *params_1;
  *(UnixEventPort **)((long)pvVar3 + 0x3d8) = params;
  *(int *)((long)pvVar3 + 0x3e0) = iVar1;
  *(long *)((long)pvVar3 + 1000) = (long)pvVar3 + 0x1a8;
  *(undefined8 *)((long)pvVar3 + 0x3f0) = 0;
  ppSVar2 = params->signalTail;
  *(SignalPromiseAdapter ***)((long)pvVar3 + 0x3f8) = ppSVar2;
  *ppSVar2 = (SignalPromiseAdapter *)((long)pvVar3 + 0x3d8);
  params->signalTail = (SignalPromiseAdapter **)((long)pvVar3 + 0x3f0);
  *(void **)((long)pvVar3 + 0x198) = pvVar3;
  *(long *)this = (long)pvVar3 + 400;
  return (Own<kj::_::AdapterPromiseNode<siginfo_t,_kj::UnixEventPort::SignalPromiseAdapter>,_kj::_::PromiseDisposer>
          )(AdapterPromiseNode<siginfo_t,_kj::UnixEventPort::SignalPromiseAdapter> *)this;
}

Assistant:

static kj::Own<T, D> alloc(Params&&... params) noexcept {
    // Implements allocPromise().
    T* ptr;
    if (!canArenaAllocate<T>()) {
      // Node too big (or needs weird alignment), fall back to regular heap allocation.
      ptr = new T(kj::fwd<Params>(params)...);
    } else {
      // Start a new arena.
      //
      // NOTE: As in appendPromise() (below), we don't implement exception-safety because it causes
      //   code bloat and these constructors probably don't throw. Instead this function is
      //   noexcept, so if a constructor does throw, it'll crash rather than leak memory.
      auto* arena = new PromiseArena;
      ptr = reinterpret_cast<T*>(arena + 1) - 1;
      ctor(*ptr, kj::fwd<Params>(params)...);
      ptr->arena = arena;
      KJ_IREQUIRE(reinterpret_cast<void*>(ptr) ==
                  reinterpret_cast<void*>(static_cast<PromiseArenaMember*>(ptr)),
          "PromiseArenaMember must be the leftmost inherited type.");
    }
    return kj::Own<T, D>(ptr);
  }